

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portioner.cpp
# Opt level: O1

void __thiscall Portioner::make_Portion(Portioner *this)

{
  int iVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  ulong uVar5;
  ostream *poVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  pointer __args;
  int iVar10;
  int iVar11;
  undefined1 auStack_58 [8];
  vector<Point_d,_std::allocator<Point_d>_> bucket;
  int local_38;
  int local_34;
  
  iVar7 = this->_Y_Bucketsize;
  if (this->_height < iVar7) {
    iVar9 = 99999;
    local_34 = 0;
    iVar10 = 0;
  }
  else {
    iVar9 = 99999;
    iVar8 = 0;
    iVar10 = 0;
    local_34 = 0;
    do {
      iVar11 = this->_X_Bucketsize;
      if (iVar11 <= this->_width) {
        local_38 = 0;
        do {
          auStack_58 = (undefined1  [8])0x0;
          bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          __args = (this->_random_points).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (__args != (this->_random_points).super__Vector_base<Point_d,_std::allocator<Point_d>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              if ((((__args->x < (double)iVar11) && ((double)local_38 <= __args->x)) &&
                  (__args->y < (double)iVar7)) && ((double)iVar8 <= __args->y)) {
                if (bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                    super__Vector_impl_data._M_start ==
                    bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  std::vector<Point_d,std::allocator<Point_d>>::_M_realloc_insert<Point_d_const&>
                            ((vector<Point_d,std::allocator<Point_d>> *)auStack_58,
                             (iterator)
                             bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                             super__Vector_impl_data._M_start,__args);
                }
                else {
                  dVar2 = __args->x;
                  dVar3 = __args->y;
                  iVar1 = __args->id;
                  uVar4 = *(undefined4 *)&__args->field_0x1c;
                  (bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                   super__Vector_impl_data._M_start)->dis = __args->dis;
                  (bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                   super__Vector_impl_data._M_start)->id = iVar1;
                  *(undefined4 *)
                   &(bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                     super__Vector_impl_data._M_start)->field_0x1c = uVar4;
                  (bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                   super__Vector_impl_data._M_start)->x = dVar2;
                  (bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                   super__Vector_impl_data._M_start)->y = dVar3;
                  bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
                }
              }
              __args = __args + 1;
            } while (__args != (this->_random_points).
                               super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                               super__Vector_impl_data._M_finish);
          }
          uVar5 = (long)bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                        super__Vector_impl_data._M_start - (long)auStack_58 >> 5;
          if (uVar5 < (ulong)(long)iVar9) {
            iVar9 = (int)uVar5;
          }
          if ((ulong)(long)iVar10 < uVar5) {
            iVar10 = (int)uVar5;
          }
          std::
          vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
          ::push_back(&this->_point_buckets,(value_type *)auStack_58);
          iVar1 = this->_X_Bucketsize;
          if (auStack_58 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_58,
                            (long)bucket.super__Vector_base<Point_d,_std::allocator<Point_d>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
          }
          local_34 = local_34 + 1;
          local_38 = local_38 + iVar1;
          iVar11 = iVar11 + iVar1;
        } while (iVar11 <= this->_width);
      }
      iVar8 = iVar8 + this->_Y_Bucketsize;
      iVar7 = iVar7 + this->_Y_Bucketsize;
    } while (iVar7 <= this->_height);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"es gibt ",8);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_34);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," Buckets. ",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Bucketmaxsize ist  ",0x13);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Bucketminsize ist  ",0x13);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  return;
}

Assistant:

void Portioner::make_Portion()
{
  int bucketcounter = 0;
  int minbucketsize = 99999;
  int maxbucketsize = 0;
//  std::vector<std::vector<Point_d>>Point_bucket;
  int ybmin = 0;
  int ybmax = _Y_Bucketsize;
  //std::cout << "ybmin is now: " <<ybmin<< "  . " <<"\n";
  //std::cout << "ybmax is now" <<ybmax<< "  . " <<"\n";
  while(ybmax <= _height)
    {
      //std::cout << "outer while loop starts: ----------------------" <<"\n";
      int xbmin = 0;
      int xbmax = _X_Bucketsize;
      //std::cout << "xbmin is now: " <<xbmin<< "  . " <<"\n";
      //std::cout << "xbmax is now" <<xbmax<< "  . " <<"\n";
      while(xbmax <=_width)
      {
        std::vector<Point_d>bucket;
        for(auto it = std::begin(_random_points); it!=std::end(_random_points); ++it){
          if(it->x < xbmax && it->x >= xbmin){
            if(it->y < ybmax && it->y >= ybmin){
              //noch ganz schön langsam da random_points nicht kleiner wird
              bucket.push_back(*it);
            }
          }
        }
        //std::cout << "Bucket ist mit  " <<bucket.size()<< " gefüllt. " <<"\n";
        if(minbucketsize > bucket.size())minbucketsize = bucket.size();
        if(maxbucketsize < bucket.size())maxbucketsize = bucket.size();
        _point_buckets.push_back(bucket);
        bucketcounter += 1;
        xbmin = xbmin+_X_Bucketsize;
        xbmax = xbmax+_X_Bucketsize;
        //std::cout << "xbmin is now: " <<xbmin<< "  . " <<"\n";
        //std::cout << "xbmax is now" <<xbmax<< "  . " <<"\n";
      }
      //std::cout << "left inner while loop:    -->>-<-<-<-<-<-<-<-<-<-<-<-     " <<"\n";
      xbmin = 0;
      xbmax = 0 + _X_Bucketsize;
      //std::cout << "xbmin is now: " <<xbmin<< "  . " <<"\n";
      //std::cout << "xbmax is now" <<xbmax<< "  . " <<"\n";
      ybmin = ybmin + _Y_Bucketsize;
      ybmax = ybmax + _Y_Bucketsize;
      //std::cout << "ybmin is now: " <<ybmin<< "  . " <<"\n";
      //std::cout << "ybmax is now" <<ybmax<< "  . " <<"\n";

    }
    std::cout << "es gibt " <<bucketcounter<< " Buckets. " <<"\n";
    std::cout << "Bucketmaxsize ist  " << maxbucketsize  <<"\n";
    std::cout << "Bucketminsize ist  " << minbucketsize  <<"\n";


    //return _point_buckets;
    return;
}